

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O3

void idx2::WriteChunk(idx2_file *Idx2,encode_data *E,channel *C,i8 Level,i8 Subband,i16 BitPlane)

{
  anon_union_8_2_2df48d06_for_stref_0 *Src;
  bitstream *Bs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte *pbVar7;
  ulong *puVar8;
  bool bVar9;
  array<unsigned_long> *Array;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  FILE *__s;
  size_t sVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  FILE *Key;
  long lVar17;
  long lVar18;
  byte *pbVar19;
  u64 uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  byte *pbVar24;
  long lVar25;
  undefined8 in_XMM0_Qa;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM4_Qb;
  stref sVar29;
  iterator ChunkMetaIt;
  file_id FileId;
  chunk_meta_info Cm;
  anon_union_8_2_2df48d06_for_stref_0 local_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  long local_c0;
  long local_b8;
  anon_union_8_2_2df48d06_for_stref_0 local_b0 [2];
  undefined1 local_a0 [8];
  chunk_meta_info local_98;
  
  iVar10 = (C->BrickDeltasStream).BitPos;
  iVar22 = iVar10 + 7;
  iVar10 = iVar10 + 0xe;
  if (-1 < iVar22) {
    iVar10 = iVar22;
  }
  pbVar12 = (C->BrickDeltasStream).BitPtr +
            ((long)(iVar10 >> 3) - (long)(C->BrickDeltasStream).Stream.Data);
  auVar26._0_8_ = (double)(long)pbVar12;
  auVar26._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _ZN4idx2L15BrickDeltasStatE_0;
  auVar1 = vminsd_avx(auVar26,auVar1);
  _ZN4idx2L15BrickDeltasStatE_0 = auVar1._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L15BrickDeltasStatE_1;
  auVar1 = vmaxsd_avx(auVar26,auVar2);
  _ZN4idx2L15BrickDeltasStatE_1 = auVar1._0_8_;
  _ZN4idx2L15BrickDeltasStatE_2 = auVar26._0_8_ + _ZN4idx2L15BrickDeltasStatE_2;
  _ZN4idx2L15BrickDeltasStatE_3 = _ZN4idx2L15BrickDeltasStatE_3 + 1;
  _ZN4idx2L15BrickDeltasStatE_4 = auVar26._0_8_ * auVar26._0_8_ + _ZN4idx2L15BrickDeltasStatE_4;
  iVar10 = (C->BrickSizeStream).BitPos;
  iVar22 = iVar10 + 7;
  iVar10 = iVar10 + 0xe;
  if (-1 < iVar22) {
    iVar10 = iVar22;
  }
  pbVar24 = (C->BrickSizeStream).BitPtr +
            ((long)(iVar10 >> 3) - (long)(C->BrickSizeStream).Stream.Data);
  auVar27._0_8_ = (double)(long)pbVar24;
  auVar27._8_8_ = in_XMM2_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L14BrickSizesStatE_0;
  auVar2 = vminsd_avx(auVar27,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = _ZN4idx2L14BrickSizesStatE_1;
  auVar1 = vmaxsd_avx(auVar27,auVar4);
  _ZN4idx2L14BrickSizesStatE_2 = auVar27._0_8_ + _ZN4idx2L14BrickSizesStatE_2;
  _ZN4idx2L14BrickSizesStatE_0 = auVar2._0_8_;
  _ZN4idx2L14BrickSizesStatE_3 = _ZN4idx2L14BrickSizesStatE_3 + 1;
  _ZN4idx2L14BrickSizesStatE_1 = auVar1._0_8_;
  _ZN4idx2L14BrickSizesStatE_4 = auVar27._0_8_ * auVar27._0_8_ + _ZN4idx2L14BrickSizesStatE_4;
  iVar10 = (C->BrickStream).BitPos;
  iVar22 = iVar10 + 7;
  iVar10 = iVar10 + 0xe;
  if (-1 < iVar22) {
    iVar10 = iVar22;
  }
  Bs = &E->ChunkStream;
  pbVar19 = (C->BrickStream).BitPtr;
  lVar17 = (E->ChunkStream).Stream.Bytes;
  pbVar7 = (C->BrickStream).Stream.Data;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  pbVar19 = pbVar19 + (long)(pbVar24 + (long)pbVar12 + ((long)(iVar10 >> 3) - (long)pbVar7) + 0x48);
  lVar14 = lVar17;
  if (lVar17 <= (long)pbVar19) {
    do {
      lVar18 = (lVar14 * 3) / 2;
      lVar14 = lVar18 + 8;
    } while (lVar14 <= (long)pbVar19);
    if (lVar17 < lVar14) {
      if (Mallocator()::Instance == '\0') {
        WriteChunk();
      }
      local_98.Addrs.Buffer.Data = (byte *)0x0;
      local_98.Addrs.Buffer.Bytes = 0;
      local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf((buffer *)(local_a0 + 8),lVar18 + 0x10,(E->ChunkStream).Stream.Alloc);
      iVar10 = (E->ChunkStream).BitPos;
      iVar22 = iVar10 + 7;
      iVar10 = iVar10 + 0xe;
      if (-1 < iVar22) {
        iVar10 = iVar22;
      }
      MemCopy(&Bs->Stream,(buffer *)(local_a0 + 8),
              (u64)((E->ChunkStream).BitPtr +
                   ((long)(iVar10 >> 3) - (long)(E->ChunkStream).Stream.Data)));
      (E->ChunkStream).BitPtr =
           local_98.Addrs.Buffer.Data +
           ((long)(E->ChunkStream).BitPtr - (long)(E->ChunkStream).Stream.Data);
      DeallocBuf(&Bs->Stream);
      (E->ChunkStream).Stream.Alloc = local_98.Addrs.Buffer.Alloc;
      (Bs->Stream).Data = local_98.Addrs.Buffer.Data;
      (E->ChunkStream).Stream.Bytes = local_98.Addrs.Buffer.Bytes;
      uVar11 = (E->ChunkStream).BitPos;
      uVar20 = (E->ChunkStream).BitBuf;
      goto LAB_00198f04;
    }
  }
  uVar20 = 0;
  uVar11 = 0;
LAB_00198f04:
  uVar21 = (long)C->NBricks;
  do {
    if (0x38 < (int)uVar11) {
      puVar8 = (ulong *)(E->ChunkStream).BitPtr;
      *puVar8 = uVar20;
      uVar20 = (uVar20 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
      (E->ChunkStream).BitBuf = uVar20;
      (E->ChunkStream).BitPtr = (byte *)((ulong)(uVar11 >> 3) + (long)puVar8);
      uVar11 = uVar11 & 7;
    }
    uVar23 = (ulong)((uint)uVar21 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar11 & 0x3f) |
             uVar20;
    (E->ChunkStream).BitBuf = uVar23;
    uVar16 = uVar11 + 7;
    if (0x37 < (int)uVar11) {
      puVar8 = (ulong *)(E->ChunkStream).BitPtr;
      *puVar8 = uVar23;
      uVar23 = ((E->ChunkStream).BitBuf >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
      (E->ChunkStream).BitBuf = uVar23;
      (E->ChunkStream).BitPtr = (byte *)((ulong)(uVar16 >> 3) + (long)puVar8);
      uVar16 = 7;
    }
    uVar20 = (ulong)(0x7f < uVar21 & (uint)bitstream::Masks.Arr[1]) << ((byte)uVar16 & 0x3f) |
             uVar23;
    uVar11 = uVar16 + 1;
    (E->ChunkStream).BitBuf = uVar20;
    bVar9 = 0x7f < uVar21;
    uVar21 = uVar21 >> 7;
  } while (bVar9);
  (E->ChunkStream).BitPos = uVar11;
  WriteStream(Bs,&C->BrickDeltasStream);
  WriteStream(Bs,&C->BrickSizeStream);
  WriteStream(Bs,&C->BrickStream);
  puVar8 = (ulong *)(E->ChunkStream).BitPtr;
  uVar21 = (E->ChunkStream).BitBuf;
  *puVar8 = uVar21;
  uVar11 = (E->ChunkStream).BitPos;
  if (0 < (int)uVar11 >> 3) {
    (E->ChunkStream).BitBuf = (uVar21 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
  }
  pbVar12 = (byte *)((long)puVar8 + (long)((int)uVar11 >> 3));
  (E->ChunkStream).BitPtr = pbVar12;
  (E->ChunkStream).BitPos = uVar11 & 7;
  auVar28._0_8_ =
       (double)(long)(pbVar12 + ((ulong)((uVar11 & 7) != 0) - (long)(E->ChunkStream).Stream.Data));
  auVar28._8_8_ = in_XMM4_Qb;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_0;
  auVar2 = vminsd_avx(auVar28,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar28,auVar6);
  _ZN4idx2L18BitPlaneChunksStatE_2 = auVar28._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_2;
  _ZN4idx2L18BitPlaneChunksStatE_0 = auVar2._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_3 = _ZN4idx2L18BitPlaneChunksStatE_3 + 1;
  _ZN4idx2L18BitPlaneChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_4 =
       auVar28._0_8_ * auVar28._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_4;
  pbVar12 = (C->BrickSizeStream).Stream.Data;
  (C->BrickDeltasStream).BitPtr = (C->BrickDeltasStream).Stream.Data;
  (C->BrickDeltasStream).BitPos = 0;
  (C->BrickDeltasStream).BitBuf = 0;
  (C->BrickSizeStream).BitPtr = pbVar12;
  (C->BrickSizeStream).BitPos = 0;
  (C->BrickSizeStream).BitBuf = 0;
  (C->BrickStream).BitPtr = (C->BrickStream).Stream.Data;
  (C->BrickStream).BitPos = 0;
  (C->BrickStream).BitBuf = 0;
  ConstructFilePath((file_id *)local_b0,Idx2,C->LastBrick,Level,Subband,BitPlane);
  __s = fopen(local_b0[0].Ptr,"ab");
  if (__s == (FILE *)0x0) {
    local_d0.Ptr = local_b0[0].Ptr;
    sVar13 = strlen(local_b0[0].Ptr);
    local_c8 = (undefined4)sVar13;
    sVar29 = GetParentPath((stref *)&local_d0);
    local_98.Addrs.Buffer.Data = (byte *)sVar29.field_0;
    local_98.Addrs.Buffer.Bytes = CONCAT44(local_98.Addrs.Buffer.Bytes._4_4_,sVar29.Size);
    CreateFullDir((stref *)(local_a0 + 8));
    __s = fopen(local_b0[0].Ptr,"ab");
  }
  pbVar12 = (E->ChunkStream).Stream.Data;
  iVar10 = (E->ChunkStream).BitPos;
  iVar22 = iVar10 + 7;
  iVar10 = iVar10 + 0xe;
  if (-1 < iVar22) {
    iVar10 = iVar22;
  }
  Key = __s;
  fwrite(pbVar12,(size_t)((E->ChunkStream).BitPtr + ((long)(iVar10 >> 3) - (long)pbVar12)),1,__s);
  Lookup<unsigned_long,idx2::chunk_meta_info>
            ((iterator *)&local_d0,(idx2 *)&E->ChunkMeta,
             (hash_table<unsigned_long,_idx2::chunk_meta_info> *)local_a0,(unsigned_long *)Key);
  if (*(char *)(*(long *)(local_c0 + 0x10) + local_b8) != '\x02') {
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Addrs.Buffer.Data = (byte *)0x0;
    local_98.Addrs.Buffer.Bytes = 0;
    local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    local_98.Addrs.Size = 0;
    local_98.Addrs.Capacity = 0;
    local_98.Addrs.Alloc = (allocator *)&Mallocator()::Instance;
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Sizes.Stream.Data = (byte *)0x0;
    local_98.Sizes.Stream.Bytes = 0;
    local_98.Sizes.Stream.Alloc = (allocator *)&Mallocator()::Instance;
    local_98.Sizes.BitPtr = (byte *)0x0;
    local_98.Sizes.BitBuf = 0;
    local_98.Sizes.BitPos = 0;
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    (*(code *)*Mallocator()::Instance)(&Mallocator()::Instance,&local_98.Sizes,0x88);
    local_98.Sizes.BitPtr = local_98.Sizes.Stream.Data;
    local_98.Sizes.BitPos = 0;
    local_98.Sizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_meta_info>
              ((iterator *)&local_d0,(unsigned_long *)local_a0,(chunk_meta_info *)(local_a0 + 8));
  }
  Array = (array<unsigned_long> *)CONCAT44(uStack_c4,local_c8);
  lVar14 = Array[1].Buffer.Bytes;
  uVar11 = *(uint *)&Array[1].Alloc;
  iVar22 = uVar11 + 0xe;
  if (-1 < (int)(uVar11 + 7)) {
    iVar22 = uVar11 + 7;
  }
  lVar17 = (Array[1].Size - (long)Array[1].Buffer.Data) + (long)(iVar22 >> 3) + 0xc;
  if (lVar14 <= lVar17) {
    Src = (anon_union_8_2_2df48d06_for_stref_0 *)(Array + 1);
    lVar18 = lVar14;
    do {
      lVar25 = (lVar18 * 3) / 2;
      lVar18 = lVar25 + 8;
    } while (lVar18 <= lVar17);
    if (lVar14 < lVar18) {
      if (Mallocator()::Instance == '\0') {
        WriteChunk();
      }
      local_98.Addrs.Buffer.Data = (byte *)0x0;
      local_98.Addrs.Buffer.Bytes = 0;
      local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf((buffer *)(local_a0 + 8),lVar25 + 0x10,Array[1].Buffer.Alloc);
      iVar22 = *(int *)&Array[1].Alloc + 7;
      iVar10 = *(int *)&Array[1].Alloc + 0xe;
      if (-1 < iVar22) {
        iVar10 = iVar22;
      }
      MemCopy((buffer *)Src,(buffer *)(local_a0 + 8),
              (long)(iVar10 >> 3) + (Array[1].Size - (long)Array[1].Buffer.Data));
      Array[1].Size =
           (i64)(local_98.Addrs.Buffer.Data + (Array[1].Size - (long)Array[1].Buffer.Data));
      DeallocBuf((buffer *)Src);
      Array[1].Buffer.Alloc = local_98.Addrs.Buffer.Alloc;
      Src->Ptr = (str)local_98.Addrs.Buffer.Data;
      Array[1].Buffer.Bytes = local_98.Addrs.Buffer.Bytes;
      uVar11 = *(uint *)&Array[1].Alloc;
    }
  }
  iVar10 = (E->ChunkStream).BitPos;
  iVar22 = iVar10 + 7;
  iVar10 = iVar10 + 0xe;
  if (-1 < iVar22) {
    iVar10 = iVar22;
  }
  uVar21 = Array[1].Capacity;
  pbVar12 = (E->ChunkStream).BitPtr + ((long)(iVar10 >> 3) - (long)(E->ChunkStream).Stream.Data);
  do {
    if (0x38 < (int)uVar11) {
      puVar8 = (ulong *)Array[1].Size;
      *puVar8 = uVar21;
      uVar21 = (uVar21 >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
      Array[1].Capacity = uVar21;
      Array[1].Size = (ulong)(uVar11 >> 3) + (long)puVar8;
      uVar11 = uVar11 & 7;
    }
    uVar21 = (ulong)((uint)pbVar12 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar11 & 0x3f)
             | uVar21;
    Array[1].Capacity = uVar21;
    uVar16 = uVar11 + 7;
    if (0x37 < (int)uVar11) {
      puVar8 = (ulong *)Array[1].Size;
      *puVar8 = uVar21;
      uVar21 = ((ulong)Array[1].Capacity >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
      Array[1].Capacity = uVar21;
      Array[1].Size = (ulong)(uVar16 >> 3) + (long)puVar8;
      uVar16 = 7;
    }
    uVar21 = (ulong)((byte *)0x7f < pbVar12 & (uint)bitstream::Masks.Arr[1]) <<
             ((byte)uVar16 & 0x3f) | uVar21;
    uVar11 = uVar16 + 1;
    Array[1].Capacity = uVar21;
    bVar9 = (byte *)0x7f < pbVar12;
    pbVar12 = (byte *)((ulong)pbVar12 >> 7);
  } while (bVar9);
  *(uint *)&Array[1].Alloc = uVar11;
  if ('\x0f' < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uVar21 = (ulong)(Idx2->BricksPerChunk).Arr[Level];
  lVar14 = 0x3f;
  if (uVar21 != 0) {
    for (; uVar21 >> lVar14 == 0; lVar14 = lVar14 + -1) {
    }
  }
  bVar15 = -(uVar21 == 0) | (byte)lVar14;
  uVar23 = C->LastBrick;
  lVar14 = Array->Size;
  if (Array->Capacity <= lVar14) {
    GrowCapacity<unsigned_long>(Array,0);
    lVar14 = Array->Size;
  }
  Array->Size = lVar14 + 1;
  *(ulong *)((Array->Buffer).Data + lVar14 * 8) =
       ((ulong)((ushort)BitPlane & 0xfff) |
       (long)((int)Subband << 0xc) + ((ulong)(byte)Level << 0x3c)) +
       (uVar23 >> ((1L << (bVar15 & 0x3f) != uVar21) + bVar15 & 0x3f)) * 0x40000;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  return;
}

Assistant:

void
WriteChunk(const idx2_file& Idx2, encode_data* E, channel* C, i8 Level, i8 Subband, i16 BitPlane)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
    BrickSizesStat.Add((f64)Size(C->BrickSizeStream));      // brick sizes
    i64 ChunkSize =
      Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
    Rewind(&E->ChunkStream);
    GrowToAccomodate(&E->ChunkStream, ChunkSize);
    WriteVarByte(&E->ChunkStream, C->NBricks);
    WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
    WriteStream(&E->ChunkStream, &C->BrickSizeStream);
    WriteStream(&E->ChunkStream, &C->BrickStream);
    Flush(&E->ChunkStream);
    BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

    /* we are done with these, rewind */
    Rewind(&C->BrickDeltasStream);
    Rewind(&C->BrickSizeStream);
    Rewind(&C->BrickStream);

    u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
    buffer Buf = ToBuffer(E->ChunkStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkAddress))
      idx2_ExitIf(true, "Write chunk failed\n");
    Rewind(&E->ChunkStream);
    return;
  }
#endif

  BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
  BrickSizesStat.Add((f64)Size(C->BrickSizeStream));       // brick sizes
  i64 ChunkSize = Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
  Rewind(&E->ChunkStream);
  GrowToAccomodate(&E->ChunkStream, ChunkSize);
  WriteVarByte(&E->ChunkStream, C->NBricks);
  WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
  WriteStream(&E->ChunkStream, &C->BrickSizeStream);
  WriteStream(&E->ChunkStream, &C->BrickStream);
  Flush(&E->ChunkStream);
  BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

  /* we are done with these, rewind */
  Rewind(&C->BrickDeltasStream);
  Rewind(&C->BrickSizeStream);
  Rewind(&C->BrickStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, C->LastBrick, Level, Subband, BitPlane);
  idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
  WriteBuffer(Fp, ToBuffer(E->ChunkStream));
  /* keep track of the chunk addresses and sizes */
  auto ChunkMetaIt = Lookup(E->ChunkMeta, FileId.Id);
  if (!ChunkMetaIt)
  {
    chunk_meta_info Cm;
    InitWrite(&Cm.Sizes, 128);
    Insert(&ChunkMetaIt, FileId.Id, Cm);
  }
  idx2_Assert(ChunkMetaIt);
  chunk_meta_info* ChunkMeta = ChunkMetaIt.Val;
  GrowToAccomodate(&ChunkMeta->Sizes, 4);
  // Write the size of the chunk stream
  WriteVarByte(&ChunkMeta->Sizes, Size(E->ChunkStream));
  u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
  PushBack(&ChunkMeta->Addrs, ChunkAddress);
  Rewind(&E->ChunkStream);
}